

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_interface.cpp
# Opt level: O1

void mt32emu_get_rom_info(mt32emu_const_context context,mt32emu_rom_info *rom_info)

{
  ROMInfo *pRVar1;
  ROMInfo *pRVar2;
  
  if (context->controlROMImage == (ROMImage *)0x0) {
    pRVar1 = (ROMInfo *)0x0;
  }
  else {
    pRVar1 = MT32Emu::ROMImage::getROMInfo(context->controlROMImage);
  }
  if (context->pcmROMImage == (ROMImage *)0x0) {
    pRVar2 = (ROMInfo *)0x0;
  }
  else {
    pRVar2 = MT32Emu::ROMImage::getROMInfo(context->pcmROMImage);
  }
  if (pRVar1 == (ROMInfo *)0x0) {
    rom_info->control_rom_id = (char *)0x0;
    rom_info->control_rom_description = (char *)0x0;
    rom_info->control_rom_sha1_digest = (char *)0x0;
  }
  else {
    rom_info->control_rom_id = pRVar1->shortName;
    rom_info->control_rom_description = pRVar1->description;
    rom_info->control_rom_sha1_digest = *pRVar1->sha1Digest;
  }
  if (pRVar2 == (ROMInfo *)0x0) {
    rom_info->pcm_rom_id = (char *)0x0;
    rom_info->pcm_rom_description = (char *)0x0;
    rom_info->pcm_rom_sha1_digest = (char *)0x0;
  }
  else {
    rom_info->pcm_rom_id = pRVar2->shortName;
    rom_info->pcm_rom_description = pRVar2->description;
    rom_info->pcm_rom_sha1_digest = *pRVar2->sha1Digest;
  }
  return;
}

Assistant:

void MT32EMU_C_CALL mt32emu_get_rom_info(mt32emu_const_context context, mt32emu_rom_info *rom_info) {
	const ROMInfo *controlROMInfo = context->controlROMImage == NULL ? NULL : context->controlROMImage->getROMInfo();
	const ROMInfo *pcmROMInfo = context->pcmROMImage == NULL ? NULL : context->pcmROMImage->getROMInfo();
	fillROMInfo(rom_info, controlROMInfo, pcmROMInfo);
}